

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O1

int archive_write_zip_finish_entry(archive_write *a)

{
  zip_conflict *zip;
  int64_t iVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  uchar *p;
  undefined1 *puVar5;
  uchar *puVar6;
  long lVar7;
  undefined1 uVar8;
  int in_ECX;
  int unaff_EBP;
  size_t sVar9;
  uchar *p_1;
  long *plVar10;
  size_t outl;
  size_t hmac_len;
  undefined1 local_88 [4];
  undefined8 uStack_84;
  undefined1 local_7c;
  undefined1 uStack_7b;
  undefined1 uStack_7a;
  undefined1 uStack_79;
  undefined1 uStack_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 local_74;
  undefined1 uStack_73;
  undefined1 uStack_72;
  undefined1 auStack_71 [17];
  archive_hmac_sha1_ctx *local_60;
  code *local_58;
  archive_crypto_ctx *local_50;
  code *local_48;
  trad_enc_ctx *local_40;
  size_t local_38;
  
  zip = (zip_conflict *)a->format_data;
  if (zip->entry_compression == COMPRESSION_DEFLATE) {
    local_40 = &zip->tctx;
    local_48 = aes_ctr_update;
    local_50 = &zip->cctx;
    local_58 = __hmac_sha1_update;
    local_60 = &zip->hctx;
    do {
      iVar3 = cm_zlib_deflate((z_streamp_conflict)&zip->stream,4);
      iVar4 = 1;
      if (iVar3 == -2) {
        iVar3 = -0x1e;
        iVar4 = 1;
      }
      else {
        sVar9 = zip->len_buf - (ulong)(zip->stream).avail_out;
        if (zip->tctx_valid == '\0') {
          if (zip->cctx_valid != '\0') {
            local_88._0_2_ = (undefined2)sVar9;
            local_88._2_2_ = (undefined2)(sVar9 >> 0x10);
            uStack_84._0_4_ = (uint32_t)(sVar9 >> 0x20);
            iVar3 = (*local_48)(local_50,zip->buf,sVar9,zip->buf,(size_t *)local_88);
            if (iVar3 < 0) {
              archive_set_error(&a->archive,-1,"Failed to encrypt file");
              iVar3 = -0x19;
              goto LAB_003eaf97;
            }
            (*local_58)(local_60,zip->buf,sVar9);
          }
        }
        else {
          trad_enc_encrypt_update(local_40,zip->buf,sVar9,zip->buf,sVar9);
        }
        iVar3 = __archive_write_output(a,zip->buf,sVar9);
        iVar4 = 1;
        if (iVar3 == 0) {
          zip->entry_compressed_written = zip->entry_compressed_written + sVar9;
          zip->written_bytes = zip->written_bytes + sVar9;
          (zip->stream).next_out = zip->buf;
          iVar4 = 2;
          iVar3 = in_ECX;
          if ((zip->stream).avail_out == 0) {
            (zip->stream).avail_out = (uInt)zip->len_buf;
            iVar4 = 0;
          }
        }
      }
LAB_003eaf97:
      in_ECX = iVar3;
    } while (iVar4 == 0);
    if (iVar4 != 2) {
      return in_ECX;
    }
    cm_zlib_deflateEnd((z_streamp_conflict)&zip->stream);
    unaff_EBP = in_ECX;
  }
  if (zip->hctx_valid != '\0') {
    local_38 = 0x14;
    __hmac_sha1_final(&zip->hctx,local_88,&local_38);
    iVar4 = __archive_write_output(a,local_88,10);
    if (iVar4 != 0) {
      return iVar4;
    }
    zip->entry_compressed_written = zip->entry_compressed_written + 10;
    zip->written_bytes = zip->written_bytes + 10;
  }
  if ((zip->entry_flags & 8) != 0) {
    local_88._0_2_ = 0x4b50;
    local_88._2_2_ = 0x807;
    if ((zip->cctx_valid == '\0') || (zip->aes_vendor != 2)) {
      uStack_84._0_4_ = zip->entry_crc32;
    }
    else {
      uStack_84._0_4_ = 0;
    }
    iVar1 = zip->entry_compressed_written;
    uStack_84._4_4_ = (undefined4)iVar1;
    if (zip->entry_uses_zip64 == 0) {
      puVar5 = &uStack_79;
      iVar1 = zip->entry_uncompressed_written;
      local_7c = (undefined1)iVar1;
      uStack_7b = (undefined1)((ulong)iVar1 >> 8);
      uStack_7a = (undefined1)((ulong)iVar1 >> 0x10);
      uVar8 = (undefined1)((ulong)iVar1 >> 0x18);
      sVar9 = 0x10;
    }
    else {
      puVar5 = auStack_71;
      local_7c = (undefined1)((ulong)iVar1 >> 0x20);
      uStack_7b = (undefined1)((ulong)iVar1 >> 0x28);
      uStack_7a = (undefined1)((ulong)iVar1 >> 0x30);
      uStack_79 = (undefined1)((ulong)iVar1 >> 0x38);
      iVar1 = zip->entry_uncompressed_written;
      uStack_78 = (undefined1)iVar1;
      uStack_77 = (undefined1)((ulong)iVar1 >> 8);
      uStack_76 = (undefined1)((ulong)iVar1 >> 0x10);
      uStack_75 = (undefined1)((ulong)iVar1 >> 0x18);
      local_74 = (undefined1)((ulong)iVar1 >> 0x20);
      uStack_73 = (undefined1)((ulong)iVar1 >> 0x28);
      uStack_72 = (undefined1)((ulong)iVar1 >> 0x30);
      uVar8 = (undefined1)((ulong)iVar1 >> 0x38);
      sVar9 = 0x18;
    }
    *puVar5 = uVar8;
    iVar4 = __archive_write_output(a,local_88,sVar9);
    zip->written_bytes = zip->written_bytes + sVar9;
    if (iVar4 != 0) {
      return -0x1e;
    }
  }
  if (((0xffffffff < zip->entry_compressed_written) ||
      (0xffffffff < zip->entry_uncompressed_written)) || (0xffffffff < zip->entry_offset)) {
    local_88._0_2_ = 1;
    lVar7 = zip->entry_uncompressed_written;
    plVar10 = &uStack_84;
    if (0xfffffffe < lVar7) {
      plVar10 = (long *)&local_7c;
      uStack_84._0_4_ = (uint32_t)lVar7;
      uStack_84._4_4_ = (undefined4)((ulong)lVar7 >> 0x20);
    }
    if (0xfffffffe < zip->entry_compressed_written) {
      *plVar10 = zip->entry_compressed_written;
      plVar10 = plVar10 + 1;
    }
    if (0xfffffffe < zip->entry_offset) {
      *plVar10 = zip->entry_offset;
      plVar10 = plVar10 + 1;
    }
    local_88._2_2_ = (short)plVar10 - (short)&uStack_84;
    puVar6 = cd_alloc(zip,(long)plVar10 - (long)local_88);
    if (puVar6 == (uchar *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate zip data");
      unaff_EBP = -0x1e;
    }
    else {
      memcpy(puVar6,local_88,(long)plVar10 - (long)local_88);
      puVar2 = zip->file_header;
      if (*(ushort *)(puVar2 + 6) < 0x2d) {
        puVar2[6] = '-';
        puVar2[7] = '\0';
      }
    }
    if (puVar6 == (uchar *)0x0) {
      return unaff_EBP;
    }
  }
  if ((zip->cctx_valid == '\0') || (zip->aes_vendor != 2)) {
    *(uint32_t *)(zip->file_header + 0x10) = zip->entry_crc32;
  }
  else {
    puVar6 = zip->file_header;
    puVar6[0x10] = '\0';
    puVar6[0x11] = '\0';
    puVar6[0x12] = '\0';
    puVar6[0x13] = '\0';
  }
  lVar7 = zip->entry_compressed_written;
  if (0xfffffffe < lVar7) {
    lVar7 = 0xffffffff;
  }
  *(int *)(zip->file_header + 0x14) = (int)lVar7;
  lVar7 = zip->entry_uncompressed_written;
  if (0xfffffffe < lVar7) {
    lVar7 = 0xffffffff;
  }
  *(int *)(zip->file_header + 0x18) = (int)lVar7;
  *(short *)(zip->file_header + 0x1e) =
       (short)(int)zip->central_directory_bytes - (short)(int)zip->file_header_extra_offset;
  lVar7 = 0xffffffff;
  if (zip->entry_offset < 0xffffffff) {
    lVar7 = zip->entry_offset;
  }
  *(int *)(zip->file_header + 0x2a) = (int)lVar7;
  return 0;
}

Assistant:

static int
archive_write_zip_finish_entry(struct archive_write *a)
{
	struct zip *zip = a->format_data;
	int ret;

#if HAVE_ZLIB_H
	if (zip->entry_compression == COMPRESSION_DEFLATE) {
		for (;;) {
			size_t remainder;

			ret = deflate(&zip->stream, Z_FINISH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.avail_out;
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.next_out = zip->buf;
			if (zip->stream.avail_out != 0)
				break;
			zip->stream.avail_out = (uInt)zip->len_buf;
		}
		deflateEnd(&zip->stream);
	}
#endif
	if (zip->hctx_valid) {
		uint8_t hmac[20];
		size_t hmac_len = 20;

		archive_hmac_sha1_final(&zip->hctx, hmac, &hmac_len);
		ret = __archive_write_output(a, hmac, AUTH_CODE_SIZE);
		if (ret != ARCHIVE_OK)
			return (ret);
		zip->entry_compressed_written += AUTH_CODE_SIZE;
		zip->written_bytes += AUTH_CODE_SIZE;
	}

	/* Write trailing data descriptor. */
	if ((zip->entry_flags & ZIP_ENTRY_FLAG_LENGTH_AT_END) != 0) {
		char d[24];
		memcpy(d, "PK\007\010", 4);
		if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
			archive_le32enc(d + 4, 0);/* no CRC.*/
		else
			archive_le32enc(d + 4, zip->entry_crc32);
		if (zip->entry_uses_zip64) {
			archive_le64enc(d + 8,
				(uint64_t)zip->entry_compressed_written);
			archive_le64enc(d + 16,
				(uint64_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 24);
			zip->written_bytes += 24;
		} else {
			archive_le32enc(d + 8,
				(uint32_t)zip->entry_compressed_written);
			archive_le32enc(d + 12,
				(uint32_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 16);
			zip->written_bytes += 16;
		}
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/* Append Zip64 extra data to central directory information. */
	if (zip->entry_compressed_written > ZIP_4GB_MAX
	    || zip->entry_uncompressed_written > ZIP_4GB_MAX
	    || zip->entry_offset > ZIP_4GB_MAX) {
		unsigned char zip64[32];
		unsigned char *z = zip64, *zd;
		memcpy(z, "\001\000\000\000", 4);
		z += 4;
		if (zip->entry_uncompressed_written >= ZIP_4GB_MAX) {
			archive_le64enc(z, zip->entry_uncompressed_written);
			z += 8;
		}
		if (zip->entry_compressed_written >= ZIP_4GB_MAX) {
			archive_le64enc(z, zip->entry_compressed_written);
			z += 8;
		}
		if (zip->entry_offset >= ZIP_4GB_MAX) {
			archive_le64enc(z, zip->entry_offset);
			z += 8;
		}
		archive_le16enc(zip64 + 2, (uint16_t)(z - (zip64 + 4)));
		zd = cd_alloc(zip, z - zip64);
		if (zd == NULL) {
			archive_set_error(&a->archive, ENOMEM,
				"Can't allocate zip data");
			return (ARCHIVE_FATAL);
		}
		memcpy(zd, zip64, z - zip64);
		/* Zip64 means version needs to be set to at least 4.5 */
		if (archive_le16dec(zip->file_header + 6) < 45)
			archive_le16enc(zip->file_header + 6, 45);
	}

	/* Fix up central directory file header. */
	if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
		archive_le32enc(zip->file_header + 16, 0);/* no CRC.*/
	else
		archive_le32enc(zip->file_header + 16, zip->entry_crc32);
	archive_le32enc(zip->file_header + 20,
		(uint32_t)zipmin(zip->entry_compressed_written,
				 ZIP_4GB_MAX));
	archive_le32enc(zip->file_header + 24,
		(uint32_t)zipmin(zip->entry_uncompressed_written,
				 ZIP_4GB_MAX));
	archive_le16enc(zip->file_header + 30,
	    (uint16_t)(zip->central_directory_bytes - zip->file_header_extra_offset));
	archive_le32enc(zip->file_header + 42,
		(uint32_t)zipmin(zip->entry_offset,
				 ZIP_4GB_MAX));

	return (ARCHIVE_OK);
}